

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManSopToTruthElem(int nVars,uint **pVars)

{
  int local_48;
  uint local_40;
  int nWords;
  int k;
  int i;
  uint Masks [5];
  uint **pVars_local;
  int nVars_local;
  
  _k = 0xccccccccaaaaaaaa;
  Masks[0] = 0xf0f0f0f0;
  Masks[1] = 0xff00ff00;
  Masks[2] = 0xffff0000;
  if (nVars < 6) {
    local_48 = 1;
  }
  else {
    local_48 = 1 << ((char)nVars - 5U & 0x1f);
  }
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    if (nWords < 5) {
      for (local_40 = 0; (int)local_40 < local_48; local_40 = local_40 + 1) {
        pVars[nWords][(int)local_40] = (&k)[nWords];
      }
    }
    else {
      for (local_40 = 0; (int)local_40 < local_48; local_40 = local_40 + 1) {
        if ((local_40 & 1 << ((char)nWords - 5U & 0x1f)) == 0) {
          pVars[nWords][(int)local_40] = 0;
        }
        else {
          pVars[nWords][(int)local_40] = 0xffffffff;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Bbl_ManSopToTruthElem( int nVars, unsigned ** pVars )
{
    unsigned Masks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    int i, k, nWords;
    nWords = (nVars <= 5 ? 1 : (1 << (nVars - 5)));
    for ( i = 0; i < nVars; i++ )
    {
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pVars[i][k] = Masks[i];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pVars[i][k] = ~(unsigned)0;
                else
                    pVars[i][k] = 0;
        }
    }
}